

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
fmt::v5::
basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<wchar_t*,std::integral_constant<bool,false>>,wchar_t>>
::int_writer<wchar_t,fmt::v5::basic_format_specs<wchar_t>>::hex_writer::operator()
          (hex_writer *this,truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_> *it
          )

{
  int iVar1;
  ulong uVar2;
  bool bVar3;
  wchar_t *pwVar4;
  size_t sVar5;
  long lVar6;
  wchar_t wVar7;
  uint uVar8;
  long lVar9;
  char *digits;
  char *pcVar10;
  long lVar11;
  char *pcVar12;
  char acStack_23 [11];
  char buffer [10];
  
  pwVar4 = (it->super_truncating_iterator_base<wchar_t_*>).out_;
  uVar2 = (it->super_truncating_iterator_base<wchar_t_*>).limit_;
  sVar5 = (it->super_truncating_iterator_base<wchar_t_*>).count_;
  wVar7 = it->blackhole_;
  pcVar10 = "0123456789ABCDEF";
  if (*(char *)(*(long *)(*(long *)this + 8) + 0x11) == 'x') {
    pcVar10 = "0123456789abcdef";
  }
  iVar1 = *(int *)(this + 8);
  lVar6 = (long)iVar1;
  pcVar12 = acStack_23 + lVar6;
  uVar8 = *(uint *)(*(long *)this + 0x10);
  do {
    *pcVar12 = pcVar10[uVar8 & 0xf];
    pcVar12 = pcVar12 + -1;
    bVar3 = 0xf < uVar8;
    uVar8 = uVar8 >> 4;
  } while (bVar3);
  if (0 < iVar1) {
    lVar9 = 0;
    do {
      if (sVar5 + lVar9 < uVar2) {
        *pwVar4 = (int)acStack_23[lVar9 + 1];
        lVar11 = 4;
      }
      else {
        lVar11 = 0;
        wVar7 = (int)acStack_23[lVar9 + 1];
      }
      pwVar4 = (wchar_t *)((long)pwVar4 + lVar11);
      lVar9 = lVar9 + 1;
    } while (lVar6 != lVar9);
    sVar5 = sVar5 + lVar6;
  }
  (it->super_truncating_iterator_base<wchar_t_*>).out_ = pwVar4;
  (it->super_truncating_iterator_base<wchar_t_*>).limit_ = uVar2;
  (it->super_truncating_iterator_base<wchar_t_*>).count_ = sVar5;
  it->blackhole_ = wVar7;
  return;
}

Assistant:

void operator()(It &&it) const {
        it = internal::format_uint<4, char_type>(
              it, self.abs_value, num_digits, self.spec.type != 'x');
      }